

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_event.hpp
# Opt level: O2

void __thiscall
asio::detail::posix_event::wait<asio::detail::conditionally_enabled_mutex::scoped_lock>
          (posix_event *this,scoped_lock *lock)

{
  ulong uVar1;
  
  uVar1 = this->state_;
  while ((uVar1 & 1) == 0) {
    this->state_ = uVar1 + 2;
    pthread_cond_wait((pthread_cond_t *)this,(pthread_mutex_t *)&lock->mutex_->mutex_);
    uVar1 = this->state_ - 2;
    this->state_ = uVar1;
  }
  return;
}

Assistant:

void wait(Lock& lock)
  {
    ASIO_ASSERT(lock.locked());
    while ((state_ & 1) == 0)
    {
      state_ += 2;
      ::pthread_cond_wait(&cond_, &lock.mutex().mutex_); // Ignore EINVAL.
      state_ -= 2;
    }
  }